

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void duckdb_je_sdallocx_default(void *ptr,size_t size,int flags)

{
  uint64_t uVar1;
  long lVar2;
  tsd_t *tsd;
  ulong uVar3;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  void **ppvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uintptr_t in_R8;
  cache_bin_t *bin;
  cache_bin_t *cache_bin;
  size_t __n;
  bool bVar8;
  te_ctx_t local_80;
  ulong local_58;
  tcaches_t *local_50;
  uintptr_t args_raw [3];
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_027efab8);
  bVar8 = true;
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
    bVar8 = (tsd->state).repr == '\0';
  }
  uVar3 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  if (uVar3 == 0) {
    if (size < 0x1001) {
      __n = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_01f7ab09;
      uVar3 = size * 2 - 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar3 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
      __n = ~uVar3 + size & uVar3;
    }
  }
  else if (uVar3 < 0x1001 && size < 0x3801) {
    uVar7 = -uVar3 & (size + uVar3) - 1;
    if (uVar7 < 0x1001) {
      __n = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar7 + 7 >> 3]];
    }
    else {
      uVar5 = uVar7 * 2 - 1;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
      __n = ~uVar5 + uVar7 & uVar5;
    }
    uVar7 = 0x4000;
    if (0x3fff < __n) goto LAB_01f7ab0e;
  }
  else if (uVar3 < 0x7000000000000001) {
    uVar7 = 0x4000;
    if (0x4000 < size) {
      if (size < 0x7000000000000001) {
        uVar7 = size * 2 - 1;
        lVar2 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar7 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
        uVar7 = ~uVar7 + size & uVar7;
      }
      else {
        uVar7 = 0;
      }
      if (uVar7 < size) goto LAB_01f7ab09;
    }
LAB_01f7ab0e:
    __n = 0;
    if (uVar7 <= (duckdb_je_sz_large_pad + (uVar3 + 0xfff & 0x7ffffffffffff000) + uVar7) - 0x1000) {
      __n = uVar7;
    }
  }
  else {
LAB_01f7ab09:
    __n = 0;
  }
  uVar6 = flags & 0xfff00;
  if (uVar6 == 0) {
LAB_01f7ab50:
    if (!bVar8) {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
        tcache.tcache = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
      }
      else {
        tcache.tcache = (tcache_t *)0x0;
      }
      goto LAB_01f7acdd;
    }
    tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
LAB_01f7ab64:
    if (__n < 0x1001) {
      if (tcache.tcache == (tcache_t *)0x0) goto LAB_01f7adcb;
      uVar6 = (uint)duckdb_je_sz_size2index_tab[__n + 7 >> 3];
LAB_01f7ab8d:
      if (uVar6 < 0x24) {
        cache_bin = (tcache.tcache)->bins + uVar6;
        ppvVar4 = cache_bin->stack_head;
        if ((tcache.tcache)->bins[uVar6].low_bits_full == (uint16_t)ppvVar4) {
          if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
            duckdb_je_tcache_bin_flush_small
                      (tsd,tcache.tcache,cache_bin,uVar6,
                       (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01f7ae6a:
            ppvVar4 = cache_bin->stack_head;
            if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
              cache_bin->stack_head = ppvVar4 + -1;
              ppvVar4[-1] = ptr;
            }
            goto LAB_01f7abc0;
          }
          goto LAB_01f7af87;
        }
        goto LAB_01f7abb4;
      }
      if (uVar6 < (tcache.tcache)->tcache_slow->tcache_nbins) {
        ppvVar4 = (tcache.tcache)->bins[uVar6].stack_head;
        if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
          cache_bin = (tcache.tcache)->bins + uVar6;
          if ((tcache.tcache)->bins[uVar6].low_bits_full == (uint16_t)ppvVar4) {
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,cache_bin,uVar6,
                       (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01f7ae6a;
          }
          goto LAB_01f7abb4;
        }
      }
      goto LAB_01f7aea0;
    }
    if (tcache.tcache != (tcache_t *)0x0) {
      uVar6 = sz_size2index_compute(__n);
      goto LAB_01f7ab8d;
    }
  }
  else {
    if ((uVar6 == 0x100) || (uVar6 >> 8 == 1)) {
      tcache.tcache = (tcache_t *)0x0;
    }
    else {
      if (uVar6 == 0) goto LAB_01f7ab50;
      local_58 = (ulong)((uVar6 >> 8) - 2);
      local_50 = duckdb_je_tcaches;
      tcache = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[local_58].field_0.tcache;
      if (tcache.tcache == (tcache_t *)0x0) {
        duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
        abort();
      }
      if (tcache.tcache == (tcache_t *)0x1) {
        tcache.tcache = duckdb_je_tcache_create_explicit(tsd);
        local_50[local_58].field_0 = tcache;
      }
    }
    if (bVar8) goto LAB_01f7ab64;
LAB_01f7acdd:
    args_raw[2] = (uintptr_t)flags;
    args_raw[0] = (uintptr_t)ptr;
    args_raw[1] = size;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_sdallocx,ptr,args_raw);
    if (duckdb_je_opt_junk_free == true) {
      switchD_016d4fed::default(ptr,0x5a,__n);
    }
    if (tcache.tcache != (tcache_t *)0x0) {
      if (__n < 0x1001) {
        uVar6 = (uint)duckdb_je_sz_size2index_tab[__n + 7 >> 3];
      }
      else {
        uVar6 = sz_size2index_compute(__n);
      }
      if (uVar6 < 0x24) {
        cache_bin = (tcache.tcache)->bins + uVar6;
        ppvVar4 = cache_bin->stack_head;
        if ((tcache.tcache)->bins[uVar6].low_bits_full != (uint16_t)ppvVar4) {
LAB_01f7abb4:
          cache_bin->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
          goto LAB_01f7abc0;
        }
        if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
LAB_01f7af87:
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
          goto LAB_01f7abc0;
        }
        duckdb_je_tcache_bin_flush_small
                  (tsd,tcache.tcache,cache_bin,uVar6,
                   (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01f7ad94:
        ppvVar4 = cache_bin->stack_head;
        if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
          cache_bin->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
        }
      }
      else {
        if (uVar6 < (tcache.tcache)->tcache_slow->tcache_nbins) {
          ppvVar4 = (tcache.tcache)->bins[uVar6].stack_head;
          if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
            cache_bin = (tcache.tcache)->bins + uVar6;
            if ((tcache.tcache)->bins[uVar6].low_bits_full != (uint16_t)ppvVar4) {
              cache_bin->stack_head = ppvVar4 + -1;
              ppvVar4[-1] = ptr;
              goto LAB_01f7abc0;
            }
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,cache_bin,uVar6,
                       (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01f7ad94;
          }
        }
LAB_01f7aea0:
        rtree_read((rtree_contents_t *)&local_80,(tsdn_t *)tsd,
                   (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                   (rtree_ctx_t *)ptr,in_R8);
        duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_80._1_7_,local_80.is_alloc));
      }
      goto LAB_01f7abc0;
    }
  }
LAB_01f7adcb:
  arena_sdalloc_no_tcache((tsdn_t *)tsd,ptr,__n);
LAB_01f7abc0:
  local_80.is_alloc = false;
  local_80.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_80.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_80.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_80.next_event_fast =
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar1 + __n;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      uVar1 <= __n) {
    duckdb_je_te_event_trigger(tsd,&local_80);
  }
  return;
}

Assistant:

JEMALLOC_NOINLINE void
sdallocx_default(void *ptr, size_t size, int flags) {
	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	size_t usize = inallocx(tsd_tsdn(tsd), size, flags);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		isfree(tsd, ptr, usize, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, size, flags};
		hook_invoke_dalloc(hook_dalloc_sdallocx, ptr, args_raw);
		isfree(tsd, ptr, usize, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));
}